

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O0

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImDrawList *this;
  ImDrawVert *pIVar3;
  int fb_width_00;
  undefined1 local_98 [8];
  ImVec4 clip_rect;
  ImDrawCmd *pcmd;
  unsigned_short *puStack_78;
  int cmd_i;
  ImDrawIdx *idx_buffer;
  ImDrawVert *vtx_buffer;
  ImDrawList *cmd_list;
  int n;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  GLint last_tex_env_mode;
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  undefined4 local_20;
  GLint last_polygon_mode [2];
  GLint last_texture;
  int fb_height;
  int fb_width;
  ImDrawData *draw_data_local;
  
  fb_width_00 = (int)((draw_data->DisplaySize).x * (draw_data->FramebufferScale).x);
  last_polygon_mode[1] = (GLint)((draw_data->DisplaySize).y * (draw_data->FramebufferScale).y);
  if ((fb_width_00 != 0) && (last_polygon_mode[1] != 0)) {
    glGetIntegerv(0x8069,last_polygon_mode);
    glGetIntegerv(0xb40,last_viewport + 3);
    glGetIntegerv(0xba2,last_scissor_box + 2);
    glGetIntegerv(0xc10,&clip_off.y);
    glGetTexEnviv(0x2300,0x2200,&clip_off);
    glPushAttrib(0x7000);
    ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width_00,last_polygon_mode[1]);
    IVar1 = draw_data->DisplayPos;
    IVar2 = draw_data->FramebufferScale;
    for (cmd_list._0_4_ = 0; (int)cmd_list < draw_data->CmdListsCount;
        cmd_list._0_4_ = (int)cmd_list + 1) {
      this = draw_data->CmdLists[(int)cmd_list];
      pIVar3 = (this->VtxBuffer).Data;
      puStack_78 = (this->IdxBuffer).Data;
      glVertexPointer(2,0x1406,0x14,pIVar3);
      glTexCoordPointer(2,0x1406,0x14,&pIVar3->uv);
      glColorPointer(4,0x1401,0x14,&pIVar3->col);
      for (pcmd._4_4_ = 0; pcmd._4_4_ < (this->CmdBuffer).Size; pcmd._4_4_ = pcmd._4_4_ + 1) {
        clip_rect._8_8_ = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,pcmd._4_4_);
        if (((ImDrawCmd *)clip_rect._8_8_)->UserCallback == (ImDrawCallback)0x0) {
          ImVec4::ImVec4((ImVec4 *)local_98);
          clip_scale.x = IVar1.x;
          cmd_list._4_4_ = IVar2.x;
          local_98._0_4_ = (*(float *)(clip_rect._8_8_ + 4) - clip_scale.x) * cmd_list._4_4_;
          clip_scale.y = IVar1.y;
          n = (int)IVar2.y;
          local_98._4_4_ = (*(float *)(clip_rect._8_8_ + 8) - clip_scale.y) * (float)n;
          clip_rect.x = (*(float *)(clip_rect._8_8_ + 0xc) - clip_scale.x) * cmd_list._4_4_;
          clip_rect.y = (*(float *)(clip_rect._8_8_ + 0x10) - clip_scale.y) * (float)n;
          if (((((float)local_98._0_4_ < (float)fb_width_00) &&
               ((float)local_98._4_4_ < (float)last_polygon_mode[1])) && (0.0 <= clip_rect.x)) &&
             (0.0 <= clip_rect.y)) {
            glScissor((int)(float)local_98._0_4_,(int)((float)last_polygon_mode[1] - clip_rect.y),
                      (int)(clip_rect.x - (float)local_98._0_4_),
                      (int)(clip_rect.y - (float)local_98._4_4_));
            glBindTexture(0xde1,*(ulong *)(clip_rect._8_8_ + 0x18) & 0xffffffff);
            glDrawElements(4,*(undefined4 *)clip_rect._8_8_,0x1403,puStack_78);
          }
        }
        else if (((ImDrawCmd *)clip_rect._8_8_)->UserCallback == (ImDrawCallback)0xffffffffffffffff)
        {
          ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width_00,last_polygon_mode[1]);
        }
        else {
          (*((ImDrawCmd *)clip_rect._8_8_)->UserCallback)(this,(ImDrawCmd *)clip_rect._8_8_);
        }
        puStack_78 = puStack_78 + *(uint *)clip_rect._8_8_;
      }
    }
    glDisableClientState(0x8076);
    glDisableClientState(0x8078);
    glDisableClientState(0x8074);
    glBindTexture(0xde1,last_polygon_mode[0]);
    glMatrixMode(0x1700);
    glPopMatrix();
    glMatrixMode(0x1701);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(0x404,last_viewport[3]);
    glPolygonMode(0x405,local_20);
    glViewport(last_scissor_box[2],last_scissor_box[3],last_viewport[0],last_viewport[1]);
    glScissor(clip_off.y,last_tex_env_mode,last_scissor_box[0],last_scissor_box[1]);
    glTexEnvi(0x2300,0x2200,clip_off.x);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer);
                }
            }
            idx_buffer += pcmd->ElemCount;
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}